

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cpp
# Opt level: O1

void part_download(string *download_address,string *file_name,Task *task,
                  queue<Task_*,_std::deque<Task_*,_std::allocator<Task_*>_>_> *taskMessageQueue)

{
  iterator *piVar1;
  _Elt_pointer ppTVar2;
  int iVar3;
  FILE *__stream;
  undefined8 uVar4;
  char range_string [60];
  Task *local_70;
  char local_68 [64];
  
  local_70 = task;
  __stream = fopen((file_name->_M_dataplus)._M_p,"rb+");
  fseeko(__stream,local_70->start,0);
  uVar4 = curl_easy_init();
  curl_easy_setopt(uVar4,0x2712,(download_address->_M_dataplus)._M_p);
  sprintf(local_68,"%ld-%ld",local_70->start,local_70->end);
  curl_easy_setopt(uVar4,0x2717,local_68);
  curl_easy_setopt(uVar4,0x2714,(local_70->proxy_server).address._M_dataplus._M_p);
  curl_easy_setopt(uVar4,0x2711,__stream);
  curl_easy_setopt(uVar4,0x4efb,progress_callback);
  curl_easy_setopt(uVar4,0x13,100);
  curl_easy_setopt(uVar4,0x14,5);
  curl_easy_setopt(uVar4,0x2749,local_70);
  curl_easy_setopt(uVar4,0x2b,0);
  iVar3 = curl_easy_perform(uVar4);
  fclose(__stream);
  if (iVar3 == 0) {
    local_70->status = 2;
    curl_easy_getinfo(uVar4,0x600009,&local_70->speed);
  }
  else {
    part_download();
  }
  pthread_mutex_lock((pthread_mutex_t *)&messageLock);
  ppTVar2 = (taskMessageQueue->c).super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppTVar2 ==
      (taskMessageQueue->c).super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<Task*,std::allocator<Task*>>::_M_push_back_aux<Task*const&>
              ((deque<Task*,std::allocator<Task*>> *)taskMessageQueue,&local_70);
  }
  else {
    *ppTVar2 = local_70;
    piVar1 = &(taskMessageQueue->c).super__Deque_base<Task_*,_std::allocator<Task_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  pthread_mutex_unlock((pthread_mutex_t *)&messageLock);
  curl_easy_cleanup(uVar4);
  return;
}

Assistant:

void
part_download(const string &download_address, const string &file_name, Task *task, queue<Task *> *taskMessageQueue) {
    // rb+ explanation: open in this mode, the file won't get destroyed. But it requires a long enough file in advance.
    FILE *file = fopen(file_name.c_str(), "rb+");
    // fseeko can take larger param as position up to 64 bytes integer.
    fseeko(file, task->start, SEEK_SET);
    CURL *curl = curl_easy_init();
    curl_easy_setopt(curl, CURLOPT_URL, download_address.c_str());
    char range_string[60]; // maybe 60 is just enough...
    sprintf(range_string, "%ld-%ld", task->start, task->end);
    curl_easy_setopt(curl, CURLOPT_RANGE, range_string);
    curl_easy_setopt(curl, CURLOPT_PROXY, task->proxy_server.address.c_str());
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, file);
    curl_easy_setopt(curl, CURLOPT_XFERINFOFUNCTION, progress_callback);
    // warning: the download will abort when meet low speed problem.
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, LOWEST_SPEED_BPS);
    curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, 5);
    curl_easy_setopt(curl, CURLOPT_XFERINFODATA, task);
    curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0L);
    // bytes per second
    int result = curl_easy_perform(curl);
    fclose(file);
    if (result != CURLE_OK) {
        task->status = STATUS_ERROR;
        fprintf(stderr, "\rerror:%s\n", curl_easy_strerror((CURLcode) result));
        task->speed = -1;// this is not enough. Error handling will happens on the top of these code.
    } else {
        task->status = STATUS_COMPLETE;
        curl_easy_getinfo(curl, CURLINFO_SPEED_DOWNLOAD_T, &(task->speed));
    }
    pthread_mutex_lock(&messageLock);
    taskMessageQueue->push(task);
    pthread_mutex_unlock(&messageLock);
    curl_easy_cleanup(curl);
}